

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  int iVar2;
  xmlXPathObjectPtr pxVar3;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar2 = ctxt->valueNr;
    if ((long)iVar2 < 1) {
      iVar2 = 0x17;
    }
    else {
      iVar1 = iVar2 + -1;
      ctxt->valueNr = iVar1;
      if (iVar2 == 1) {
        pxVar3 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar3 = ctxt->valueTab[(long)iVar2 + -2];
      }
      ctxt->value = pxVar3;
      pxVar3 = ctxt->valueTab[iVar1];
      ctxt->valueTab[iVar1] = (xmlXPathObjectPtr)0x0;
      if (pxVar3 != (xmlXPathObjectPtr)0x0) {
        if (pxVar3->type != XPATH_BOOLEAN) {
          iVar2 = xmlXPathCastToBoolean(pxVar3);
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          pxVar3 = xmlXPathCacheNewBoolean(ctxt,iVar2);
        }
        xmlXPathValuePush(ctxt,pxVar3);
        return;
      }
      iVar2 = 10;
    }
  }
  else {
    iVar2 = 0xc;
  }
  xmlXPathErr(ctxt,iVar2);
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = xmlXPathValuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_BOOLEAN) {
        int boolval = xmlXPathCastToBoolean(cur);

        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheNewBoolean(ctxt, boolval);
    }
    xmlXPathValuePush(ctxt, cur);
}